

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall Json::StyledStreamWriter::~StyledStreamWriter(StyledStreamWriter *this)

{
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  return;
}

Assistant:

~StyledStreamWriter() {}